

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.c
# Opt level: O1

void write_current_results
               (double **results,uint global_iteration,clock_t start_time,clock_t finish_time,
               Gas_parameters *gas_parameters,
               Iterative_Method_parameters *iterative_method_parameters,Grid *grid,
               double *space_coordinates,double *V,double *G)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  
  pdVar1 = results[1];
  pdVar2 = results[2];
  pdVar3 = results[3];
  pdVar4 = results[4];
  pdVar5 = results[5];
  pdVar6 = results[6];
  pdVar7 = results[7];
  (*results)[global_iteration] = (double)(finish_time - start_time) / 1000000.0;
  dVar8 = residual_norm_C(V,grid->X_nodes,space_coordinates,gas_parameters->time_upper_boundary,
                          u_exact);
  pdVar1[global_iteration] = dVar8;
  dVar8 = residual_norm_L2(V,grid->X_nodes,space_coordinates,gas_parameters->time_upper_boundary,
                           u_exact);
  pdVar2[global_iteration] = dVar8;
  dVar8 = residual_norm_C(G,grid->X_nodes,space_coordinates,gas_parameters->time_upper_boundary,
                          g_exact);
  pdVar3[global_iteration] = dVar8;
  dVar8 = residual_norm_L2(G,grid->X_nodes,space_coordinates,gas_parameters->time_upper_boundary,
                           g_exact);
  pdVar4[global_iteration] = dVar8;
  pdVar6[global_iteration] = grid->X_step;
  pdVar5[global_iteration] = grid->T_step;
  pdVar7[global_iteration] = iterative_method_parameters->relaxation_constant;
  return;
}

Assistant:

void write_current_results (
    double ** results,
    unsigned global_iteration, 
    clock_t start_time,
    clock_t finish_time,
    Gas_parameters const * gas_parameters,
    Iterative_Method_parameters const * iterative_method_parameters,
    Grid const * grid,
    double const * space_coordinates,
    double const * V,
    double const * G) {

  double * time_elapsed_at_iteration        = results[0],
         * residual_norm_V_C                = results[1],
         * residual_norm_V_L2               = results[2],
         * residual_norm_G_C                = results[3],
         * residual_norm_G_L2               = results[4],
         * time_step_at_iteration           = results[5],
         * space_step_at_iteration          = results[6],
         * relaxation_constant_at_iteration = results[7];

  time_elapsed_at_iteration[global_iteration] = (finish_time - start_time) / (double) CLOCKS_PER_SEC;
  residual_norm_V_C[global_iteration]         = residual_norm_C (V, 
                                                                 grid->X_nodes, 
                                                                 space_coordinates, 
                                                                 gas_parameters->time_upper_boundary, 
                                                                 u_exact);
  residual_norm_V_L2[global_iteration]        = residual_norm_L2 (V,
                                                                  grid->X_nodes, 
                                                                  space_coordinates, 
                                                                  gas_parameters->time_upper_boundary, 
                                                                  u_exact);
  residual_norm_G_C[global_iteration]         = residual_norm_C (G, 
                                                                 grid->X_nodes, 
                                                                 space_coordinates, 
                                                                 gas_parameters->time_upper_boundary, 
                                                                 g_exact);
  residual_norm_G_L2[global_iteration]        = residual_norm_L2 (G, 
                                                                  grid->X_nodes, 
                                                                  space_coordinates, 
                                                                  gas_parameters->time_upper_boundary, 
                                                                  g_exact);
  space_step_at_iteration[global_iteration] = grid->X_step;
  time_step_at_iteration[global_iteration] = grid->T_step;
  relaxation_constant_at_iteration[global_iteration] = iterative_method_parameters->relaxation_constant;
  return;
}